

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_number_long_zero(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *__needle;
  void *pvVar9;
  void *pvVar10;
  char *pcVar11;
  undefined8 extraout_RAX;
  char *pcVar12;
  void *pvVar13;
  undefined8 extraout_RAX_00;
  undefined1 *__n;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined8 extraout_RAX_01;
  void *__s2;
  undefined1 *puVar16;
  undefined8 extraout_RAX_02;
  int *__haystack;
  undefined8 extraout_RAX_03;
  long *plVar17;
  undefined8 extraout_RAX_04;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  undefined **ppuVar23;
  long lVar24;
  undefined **ppuVar25;
  int *piVar26;
  undefined **ppuVar27;
  int *piVar28;
  double dVar29;
  int extraout_XMM0_Db;
  bson_iter_t iter;
  bson_t b;
  bson_error_t error;
  code **ppcVar30;
  undefined4 uStack_45dc;
  undefined8 uStack_45d8;
  undefined2 uStack_45d0;
  int iStack_45c8;
  int iStack_45c4;
  char acStack_45c0 [504];
  code *pcStack_43c8;
  undefined1 auStack_43b8 [512];
  char *pcStack_41b8;
  code *pcStack_41b0;
  int iStack_41a0;
  int iStack_419c;
  char acStack_4198 [504];
  long *plStack_3fa0;
  char *pcStack_3f98;
  char *pcStack_3f90;
  undefined **ppuStack_3f88;
  long lStack_3f10;
  long lStack_3f08;
  undefined1 auStack_3f00 [128];
  undefined1 auStack_3e80 [232];
  undefined1 auStack_3d98 [608];
  long *plStack_3b38;
  code *pcStack_3b30;
  undefined1 auStack_3b28 [8];
  char acStack_3b20 [16];
  char *pcStack_3b10;
  code *pcStack_3b08;
  uint uStack_3a84;
  undefined8 uStack_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 uStack_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 uStack_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined1 auStack_39b8 [648];
  int *piStack_3730;
  char *pcStack_3728;
  undefined **ppuStack_3720;
  undefined1 *puStack_3718;
  undefined **ppuStack_3710;
  code *pcStack_3708;
  undefined1 auStack_3700 [240];
  undefined1 auStack_3610 [648];
  code *apcStack_3388 [16];
  undefined *puStack_3308;
  undefined1 auStack_3300 [200];
  int iStack_3238;
  int iStack_3234;
  int aiStack_3230 [160];
  int *piStack_2fb0;
  double *pdStack_2fa8;
  undefined **ppuStack_2fa0;
  int *piStack_2f98;
  int *piStack_2f90;
  code *apcStack_2f88 [16];
  double dStack_2f08;
  int aiStack_2f00 [50];
  int iStack_2e38;
  int iStack_2e34;
  int aiStack_2e30 [160];
  undefined8 uStack_2bb0;
  undefined1 *puStack_2ba8;
  char *pcStack_2ba0;
  char *pcStack_2b98;
  undefined **ppuStack_2b90;
  code *pcStack_2b88;
  int iStack_2b80;
  int iStack_2b7c;
  char acStack_2b78 [504];
  undefined1 auStack_2980 [336];
  char *pcStack_2830;
  undefined1 *puStack_2828;
  undefined1 *puStack_2820;
  void *pvStack_2818;
  void *pvStack_2810;
  code *pcStack_2808;
  undefined1 auStack_2800 [128];
  char acStack_2780 [232];
  undefined1 auStack_2698 [648];
  char *pcStack_2410;
  code *pcStack_2408;
  undefined1 auStack_2400 [128];
  char acStack_2380 [224];
  int iStack_22a0;
  int iStack_229c;
  char acStack_2298 [640];
  char *pcStack_2018;
  void *pvStack_2010;
  code *pcStack_2008;
  undefined1 auStack_2000 [128];
  char acStack_1f80 [232];
  undefined1 auStack_1e98 [648];
  char *pcStack_1c10;
  code *pcStack_1c08;
  undefined1 auStack_1c00 [232];
  int iStack_1b18;
  int iStack_1b14;
  char acStack_1b10 [640];
  char *pcStack_1890;
  code *apcStack_1888 [16];
  uint uStack_1804;
  undefined1 auStack_1800 [4];
  uint uStack_17fc;
  undefined1 auStack_1738 [648];
  undefined1 *puStack_14b0;
  undefined1 *puStack_14a8;
  undefined1 *puStack_14a0;
  void *pvStack_1498;
  void *pvStack_1490;
  code *pcStack_1488;
  uint uStack_147c;
  void *pvStack_1478;
  char *pcStack_1470;
  void *pvStack_1468;
  char *pcStack_1460;
  void *pvStack_1458;
  char *pcStack_1450;
  undefined1 *puStack_1448;
  char *pcStack_1440;
  undefined1 *puStack_1438;
  char *pcStack_1430;
  undefined8 uStack_1428;
  char *pcStack_1420;
  undefined8 uStack_1418;
  char *pcStack_1410;
  undefined8 uStack_1408;
  undefined1 auStack_1400 [4];
  uint uStack_13fc;
  undefined1 auStack_1338 [592];
  undefined8 uStack_10e8;
  char *pcStack_10e0;
  char *pcStack_10d8;
  char *pcStack_10d0;
  char *pcStack_10c8;
  char *pcStack_10c0;
  char *pcStack_10b8;
  char *pcStack_10b0;
  char *pcStack_10a8;
  char *pcStack_10a0;
  char *pcStack_1098;
  char *pcStack_1090;
  code *apcStack_1088 [7];
  undefined8 uStack_1050;
  void *pvStack_1048;
  char *pcStack_1040;
  void *pvStack_1038;
  char *pcStack_1030;
  undefined8 uStack_1028;
  char *pcStack_1020;
  void *pvStack_1018;
  char *pcStack_1010;
  undefined8 uStack_1008;
  char acStack_1000 [4];
  uint uStack_ffc;
  undefined1 auStack_f38 [648];
  undefined **ppuStack_cb0;
  char *pcStack_ca8;
  long lStack_ca0;
  undefined1 *puStack_c98;
  undefined1 *puStack_c90;
  code *pcStack_c88;
  int iStack_c80;
  int iStack_c7c;
  char acStack_c78 [504];
  undefined1 auStack_a80 [168];
  undefined8 uStack_9d8;
  long lStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_9c0;
  char *pcStack_9b8;
  char *pcStack_9b0;
  char *pcStack_9a8;
  char *pcStack_9a0;
  char *pcStack_998;
  long lStack_990;
  undefined8 uStack_988;
  char *pcStack_980;
  char *pcStack_978;
  char *pcStack_970;
  char *pcStack_968;
  long lStack_960;
  char *pcStack_958;
  char *pcStack_950;
  char *pcStack_948;
  char *pcStack_940;
  char *pcStack_938;
  char *pcStack_930;
  char *pcStack_928;
  char *pcStack_920;
  char *pcStack_918;
  char *pcStack_910;
  code *apcStack_908 [12];
  undefined8 uStack_8a8;
  char *pcStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 uStack_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 uStack_840;
  undefined8 uStack_838;
  char *apcStack_830 [22];
  char acStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [648];
  code *pcStack_408;
  undefined1 auStack_400 [128];
  undefined1 local_380 [240];
  undefined1 local_290 [648];
  
  pcStack_408 = (code *)0x131cbd;
  cVar1 = bson_init_from_json(local_380,"{ \"key\": { \"$numberLong\": \"0\" }}",0xffffffffffffffff,
                              local_290);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x131cd1;
    cVar1 = bson_iter_init(auStack_400,local_380);
    if (cVar1 == '\0') {
      pcStack_408 = (code *)0x131d19;
      test_bson_json_number_long_zero_cold_2();
LAB_00131d19:
      pcStack_408 = (code *)0x131d1e;
      test_bson_json_number_long_zero_cold_3();
LAB_00131d1e:
      pcStack_408 = (code *)0x131d23;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_408 = (code *)0x131ce4;
      cVar1 = bson_iter_find(auStack_400,"key");
      if (cVar1 == '\0') goto LAB_00131d19;
      pcStack_408 = (code *)0x131cf0;
      iVar2 = bson_iter_type(auStack_400);
      if (iVar2 != 0x12) goto LAB_00131d1e;
      pcStack_408 = (code *)0x131cfd;
      lVar5 = bson_iter_int64(auStack_400);
      if (lVar5 == 0) {
        pcStack_408 = (code *)0x131d0f;
        bson_destroy(local_380);
        return;
      }
    }
    pcStack_408 = (code *)0x131d28;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_408 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_908[0] = (code *)0x131d52;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  lVar5 = bson_bcon_magic();
  apcStack_908[0] = (code *)0x131d7d;
  pcStack_8a0 = (char *)bcon_new(0,"a",lVar5,0xc,"b",0);
  apcStack_908[0] = (code *)0x131da0;
  uStack_8a8 = bcon_new(0,"a",lVar5,0xc,"b",0);
  apcStack_908[0] = (code *)0x131dc6;
  uVar6 = bcon_new(0,"var",lVar5,0xf,1,0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x131dec;
  uStack_838 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  apcStack_908[0] = (code *)0x131e19;
  uVar7 = bcon_new(0,"var2",lVar5,0x11,2,0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x131e3f;
  uStack_840 = bcon_new(0,"a",lVar5,0xe,"b",uVar7);
  apcStack_908[0] = (code *)0x0;
  pcStack_918 = "d";
  pcStack_920 = (char *)0xe;
  pcStack_930 = "c";
  pcStack_938 = (char *)0x131e89;
  pcStack_928 = (char *)lVar5;
  pcStack_910 = (char *)uVar7;
  uStack_878 = uVar7;
  uStack_848 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_920 = "}";
  pcStack_928 = "value2";
  pcStack_930 = (char *)0x0;
  pcStack_940 = "key2";
  pcStack_948 = "{";
  pcStack_950 = "subdoc";
  pcStack_958 = "value";
  lStack_960 = 0;
  pcStack_970 = "key1";
  pcStack_978 = "{";
  pcStack_980 = "c";
  uStack_988 = 0x131f0d;
  pcStack_968 = (char *)lVar5;
  pcStack_938 = (char *)lVar5;
  uStack_850 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x131f51;
  uStack_870 = uVar6;
  uStack_858 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  apcStack_908[0] = (code *)0x131f7a;
  uStack_880 = bcon_new(0,"var","{","}",0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x131fa2;
  uStack_860 = bcon_new(0,"a",lVar5,0xe,"b",uStack_880);
  apcStack_908[0] = (code *)0x0;
  pcStack_910 = "}";
  pcStack_918 = "}";
  pcStack_920 = (char *)0x3;
  pcStack_928 = (char *)0xf;
  pcStack_938 = "z";
  pcStack_940 = "{";
  pcStack_948 = "d3";
  pcStack_950 = (char *)0x1;
  pcStack_958 = (char *)0xf;
  pcStack_968 = "x";
  pcStack_970 = "{";
  pcStack_978 = "d2";
  pcStack_980 = (char *)0x1;
  uStack_988 = 0x11;
  pcStack_998 = "n";
  pcStack_9a0 = "}";
  pcStack_9a8 = "{";
  pcStack_9b0 = "d";
  pcStack_9b8 = "]";
  uStack_9c0 = 2;
  uStack_9c8 = 0xf;
  uStack_9d8 = 0x132050;
  lStack_9d0 = lVar5;
  lStack_990 = lVar5;
  lStack_960 = lVar5;
  pcStack_930 = (char *)lVar5;
  uStack_888 = bcon_new(0,"arr","[",lVar5,0xf,1);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x13208c;
  uStack_868 = bcon_new(0,"a",lVar5,0xe,"b",uStack_888);
  apcStack_908[0] = (code *)0x13209d;
  uStack_890 = bson_new();
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x1320c5;
  pcVar8 = (char *)bcon_new(0,"a",lVar5,0xe,"b",uStack_890);
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_920 = "c";
  pcStack_928 = (char *)0x132108;
  uStack_898 = bcon_new(0,"x","{","$code",lVar5,0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x13212d;
  apcStack_830[0x15] = (char *)bcon_new(0,"a",lVar5,0xe,"b",uStack_898);
  apcStack_830[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_830[1] = pcStack_8a0;
  apcStack_830[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_830[3] = (char *)uStack_8a8;
  apcStack_830[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_830[5] = (char *)uStack_838;
  apcStack_830[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_830[7] = (char *)uStack_840;
  apcStack_830[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_830[9] = (char *)uStack_850;
  apcStack_830[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_830[0xb] = (char *)uStack_848;
  apcStack_830[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_830[0xd] = (char *)uStack_858;
  apcStack_830[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_830[0xf] = (char *)uStack_860;
  apcStack_830[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_830[0x11] = (char *)uStack_868;
  apcStack_830[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_830[0x13] = pcVar8;
  apcStack_830[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar22 = (char *)0x8;
  pcVar12 = acStack_780;
  pcVar11 = "b";
  while( true ) {
    apcStack_908[0] = (code *)0x13229d;
    cVar1 = bson_init_from_json(pcVar12,*(undefined8 *)((long)&uStack_838 + (long)pcVar22),
                                0xffffffffffffffff,auStack_6b8);
    __needle = pcVar22;
    if (cVar1 == '\0') break;
    apcStack_908[0] = (code *)0x1322b0;
    pcStack_8a0 = (char *)bson_get_data(pcVar12);
    lVar5 = *(long *)((long)apcStack_830 + (long)pcVar22);
    apcStack_908[0] = (code *)0x1322c5;
    __needle = (char *)bson_get_data(lVar5);
    if (*(uint *)(lVar5 + 4) != uStack_77c) {
LAB_00132392:
      pcVar12 = acStack_780;
      apcStack_908[0] = (code *)0x1323a4;
      pcVar11 = (char *)bson_as_canonical_extended_json(pcVar12);
      apcStack_908[0] = (code *)0x1323b1;
      uVar6 = bson_as_canonical_extended_json(lVar5);
      pcVar8 = pcStack_8a0;
      uVar3 = *(uint *)(lVar5 + 4);
      if (uStack_77c == 0) goto LAB_001323e2;
      uVar20 = 0;
      goto LAB_001323c8;
    }
    apcStack_908[0] = (code *)0x1322e1;
    pvVar9 = (void *)bson_get_data(lVar5);
    apcStack_908[0] = (code *)0x1322ec;
    pvVar10 = (void *)bson_get_data(pcVar12);
    apcStack_908[0] = (code *)0x1322fb;
    iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(lVar5 + 4));
    if (iVar2 != 0) goto LAB_00132392;
    apcStack_908[0] = (code *)0x13230e;
    bson_destroy(pcVar12);
    pcVar22 = pcVar22 + 0x10;
    pcVar11 = pcVar12;
    pcVar8 = __needle;
    if (pcVar22 == (char *)0xb8) {
      lVar5 = 8;
      do {
        apcStack_908[0] = (code *)0x132331;
        bson_destroy(*(undefined8 *)((long)apcStack_830 + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0xb8);
      apcStack_908[0] = (code *)0x13234b;
      bson_destroy(uStack_870);
      apcStack_908[0] = (code *)0x132358;
      bson_destroy(uStack_878);
      apcStack_908[0] = (code *)0x132365;
      bson_destroy(uStack_880);
      apcStack_908[0] = (code *)0x13236f;
      bson_destroy(uStack_888);
      apcStack_908[0] = (code *)0x132379;
      bson_destroy(uStack_898);
      apcStack_908[0] = (code *)0x132383;
      bson_destroy(uStack_890);
      return;
    }
  }
LAB_001324a3:
  apcStack_908[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar24 = 8;
  pcStack_930 = pcVar11;
  pcStack_928 = __needle;
  pcStack_920 = pcVar8;
  pcStack_918 = pcVar12;
  pcStack_910 = (char *)lVar5;
  apcStack_908[0] = (code *)&pcStack_408;
  do {
    pcStack_c88 = (code *)0x1324f7;
    cVar1 = bson_init_from_json(auStack_a80,*(undefined8 *)(&UNK_00163268 + lVar24),
                                0xffffffffffffffff,&iStack_c80);
    if (cVar1 != '\0') {
      pcStack_c88 = (code *)0x132544;
      test_bson_json_code_errors_cold_3();
LAB_00132544:
      pcStack_c88 = (code *)0x132549;
      test_bson_json_code_errors_cold_2();
LAB_00132549:
      pcStack_c88 = (code *)0x132569;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_c78,
              __needle);
      pcStack_c88 = (code *)0x13256e;
      abort();
    }
    if (iStack_c80 != 1) {
      pcStack_c88 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_cb0 = &PTR_anon_var_dwarf_1aa32_00163270;
      apcStack_1088[0] = (code *)0x132590;
      pcStack_ca8 = __needle;
      lStack_ca0 = lVar24;
      puStack_c98 = auStack_a80;
      puStack_c90 = (undefined1 *)&iStack_c80;
      pcStack_c88 = (code *)apcStack_908;
      uVar6 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_1088[0] = (code *)0x1325af;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar10 = (void *)0x0;
      pcVar12 = "$ref";
      pcStack_1090 = (char *)0x0;
      pcStack_1098 = "}";
      pcStack_10a0 = oid_zero_oid;
      pcStack_10a8 = (char *)0x6;
      pcStack_10b8 = "$id";
      pcStack_10c0 = "collection";
      pcStack_10c8 = (char *)0x132610;
      pcStack_10b0 = (char *)uVar6;
      pvStack_1048 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_1090 = (char *)0x0;
      pcStack_1098 = "}";
      pcStack_10a0 = (char *)0x1;
      pcStack_10a8 = (char *)0xf;
      pcStack_10b8 = "$id";
      pcStack_10c0 = "collection";
      pcStack_10c8 = (char *)0x132660;
      pcStack_10b0 = (char *)uVar6;
      uStack_1050 = bcon_new(0,"key","{","$ref",uVar6,0);
      apcStack_1088[0] = (code *)0x0;
      pcStack_1090 = "}";
      pcStack_1098 = "}";
      pcStack_10a0 = (char *)0x1;
      pcStack_10a8 = (char *)0xf;
      pcStack_10b8 = "a";
      pcStack_10c0 = "{";
      pcStack_10c8 = "$id";
      pcStack_10d0 = "collection";
      pcStack_10d8 = (char *)0x1326b8;
      pcStack_10b0 = (char *)uVar6;
      pvVar9 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_1090 = (char *)0x0;
      pcStack_1098 = "}";
      pcStack_10a0 = (char *)0x1;
      pcStack_10a8 = (char *)0x7;
      pcStack_10b8 = "meta";
      pcStack_10c0 = (char *)0x1;
      pcStack_10c8 = (char *)0xf;
      pcStack_10d8 = "$id";
      pcStack_10e0 = "collection";
      uStack_10e8 = 0x13271b;
      pcStack_10d0 = (char *)uVar6;
      pcStack_10b0 = (char *)uVar6;
      uStack_1008 = bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_1040 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_1038 = pvStack_1048;
      pcStack_1030 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_1028 = uStack_1050;
      pcStack_1020 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_1018 = pvVar9;
      pcStack_1010 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar8 = "key";
      goto LAB_00132775;
    }
    if (iStack_c7c != 2) goto LAB_00132544;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1aa32_00163270 + lVar24);
    pcStack_c88 = (code *)0x13251e;
    pcVar12 = strstr(acStack_c78,__needle);
    if (pcVar12 == (char *)0x0) goto LAB_00132549;
    lVar24 = lVar24 + 0x10;
    if (lVar24 == 0x98) {
      return;
    }
  } while( true );
  while( true ) {
    if (pcStack_8a0[uVar20] != __needle[uVar20]) goto LAB_00132488;
    uVar20 = uVar20 + 1;
    if (uStack_77c == (uint)uVar20) break;
LAB_001323c8:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_001323e2:
  uVar4 = uStack_77c;
  if (uStack_77c < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_908[0] = (code *)0x132407;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar11,uVar6);
    apcStack_908[0] = (code *)0x13241f;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar11 = (char *)(ulong)uVar3;
    apcStack_908[0] = (code *)0x132439;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_8a8 = CONCAT44(uStack_8a8._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar12 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132494;
    pcVar11 = (char *)(ulong)uStack_77c;
    apcStack_908[0] = (code *)0x132460;
    pcVar22 = (char *)write(uVar3,pcVar8,(size_t)pcVar11);
    if (pcVar22 != pcVar11) goto LAB_00132499;
    pcVar11 = (char *)(ulong)*(uint *)(lVar5 + 4);
    apcStack_908[0] = (code *)0x132477;
    pcVar22 = (char *)write(uVar4,__needle,(size_t)pcVar11);
    if (pcVar22 != pcVar11) goto LAB_0013249e;
    uVar20 = (ulong)uVar4;
    apcStack_908[0] = (code *)0x132488;
    test_bson_json_code_cold_4();
    uVar6 = extraout_RAX;
LAB_00132488:
    uVar20 = uVar20 & 0xffffffff;
  }
  apcStack_908[0] = (code *)0x132494;
  test_bson_json_code_cold_6();
LAB_00132494:
  apcStack_908[0] = (code *)0x132499;
  test_bson_json_code_cold_5();
LAB_00132499:
  apcStack_908[0] = (code *)0x13249e;
  test_bson_json_code_cold_2();
LAB_0013249e:
  apcStack_908[0] = (code *)0x1324a3;
  test_bson_json_code_cold_3();
  goto LAB_001324a3;
LAB_00132775:
  apcStack_1088[0] = (code *)0x132791;
  cVar1 = bson_init_from_json(acStack_1000,*(undefined8 *)((long)&pcStack_1040 + (long)pvVar10),
                              0xffffffffffffffff,auStack_f38);
  pcVar11 = acStack_1000;
  pvVar13 = pvVar10;
  if (cVar1 == '\0') goto LAB_0013293d;
  apcStack_1088[0] = (code *)0x1327a4;
  pvStack_1048 = (void *)bson_get_data(acStack_1000);
  pcVar11 = *(char **)((long)&pvStack_1038 + (long)pvVar10);
  apcStack_1088[0] = (code *)0x1327b6;
  pvVar13 = (void *)bson_get_data(pcVar11);
  if (*(uint *)(pcVar11 + 4) != uStack_ffc) {
LAB_0013282b:
    pcVar12 = acStack_1000;
    apcStack_1088[0] = (code *)0x13283d;
    pcVar8 = (char *)bson_as_canonical_extended_json(pcVar12);
    apcStack_1088[0] = (code *)0x13284a;
    uVar6 = bson_as_canonical_extended_json(pcVar11);
    pvVar9 = pvStack_1048;
    uVar3 = *(uint *)(pcVar11 + 4);
    if (uStack_ffc == 0) goto LAB_00132879;
    uVar20 = 0;
    goto LAB_00132860;
  }
  apcStack_1088[0] = (code *)0x1327cd;
  pcVar12 = (char *)bson_get_data(pcVar11);
  apcStack_1088[0] = (code *)0x1327d8;
  pvVar9 = (void *)bson_get_data(acStack_1000);
  apcStack_1088[0] = (code *)0x1327e6;
  iVar2 = bcmp(pcVar12,pvVar9,(ulong)*(uint *)(pcVar11 + 4));
  if (iVar2 != 0) goto LAB_0013282b;
  apcStack_1088[0] = (code *)0x1327f5;
  bson_destroy(acStack_1000);
  pvVar10 = (void *)((long)pvVar10 + 0x10);
  pcVar8 = acStack_1000;
  pvVar9 = pvVar13;
  if (pvVar10 == (void *)0x40) {
    lVar5 = 8;
    do {
      apcStack_1088[0] = (code *)0x132812;
      bson_destroy(*(undefined8 *)((long)&pcStack_1040 + lVar5));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x48);
    return;
  }
  goto LAB_00132775;
  while( true ) {
    if (*(char *)((long)pvStack_1048 + uVar20) != *(char *)((long)pvVar13 + uVar20))
    goto LAB_00132922;
    uVar20 = uVar20 + 1;
    if (uStack_ffc == (uint)uVar20) break;
LAB_00132860:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_00132879:
  uVar4 = uStack_ffc;
  if (uStack_ffc < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_1088[0] = (code *)0x13289e;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar8,uVar6);
    apcStack_1088[0] = (code *)0x1328b6;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar8 = (char *)(ulong)uVar3;
    apcStack_1088[0] = (code *)0x1328d1;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_1050 = CONCAT44(uStack_1050._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar12 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013292e;
    pcVar8 = (char *)(ulong)uStack_ffc;
    apcStack_1088[0] = (code *)0x1328fb;
    pcVar22 = (char *)write(uVar3,pvVar9,(size_t)pcVar8);
    if (pcVar22 != pcVar8) goto LAB_00132933;
    pcVar11 = (char *)(ulong)*(uint *)(pcVar11 + 4);
    apcStack_1088[0] = (code *)0x132911;
    pcVar22 = (char *)write(uVar4,pvVar13,(size_t)pcVar11);
    if (pcVar22 != pcVar11) goto LAB_00132938;
    uVar20 = (ulong)uVar4;
    apcStack_1088[0] = (code *)0x132922;
    test_bson_json_dbref_cold_4();
    uVar6 = extraout_RAX_00;
LAB_00132922:
    uVar20 = uVar20 & 0xffffffff;
  }
  apcStack_1088[0] = (code *)0x13292e;
  test_bson_json_dbref_cold_6();
LAB_0013292e:
  apcStack_1088[0] = (code *)0x132933;
  test_bson_json_dbref_cold_5();
LAB_00132933:
  apcStack_1088[0] = (code *)0x132938;
  test_bson_json_dbref_cold_2();
LAB_00132938:
  apcStack_1088[0] = (code *)0x13293d;
  test_bson_json_dbref_cold_3();
LAB_0013293d:
  apcStack_1088[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  pcStack_1488 = (code *)0x132967;
  pcStack_10b0 = pcVar11;
  pcStack_10a8 = pcVar8;
  pcStack_10a0 = pcVar12;
  pcStack_1098 = (char *)pvVar13;
  pcStack_1090 = (char *)pvVar9;
  apcStack_1088[0] = (code *)&pcStack_c88;
  uVar6 = bson_bcon_magic();
  pcStack_1488 = (code *)0x132989;
  pvStack_1478 = (void *)bcon_new(0,"euro",uVar6,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_1488 = (code *)0x1329ad;
  pvVar9 = (void *)bcon_new(0,"crlf",uVar6,0,"\r\n",0);
  pcStack_1488 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar6,0,"\"",0);
  pcStack_1488 = (code *)0x1329f1;
  puVar14 = (undefined1 *)bcon_new(0,"backslash",uVar6,0,"\\",0);
  pcStack_1488 = (code *)0x132a0f;
  uVar7 = bcon_new(0,"",uVar6,0,"",0);
  pcStack_1488 = (code *)0x132a31;
  uVar6 = bcon_new(0,"escapes",uVar6,0,"\f\b\t",0);
  pcStack_1488 = (code *)0x132a39;
  uStack_1408 = bson_new();
  pcStack_1470 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_1468 = pvStack_1478;
  pcStack_1460 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_1450 = "{ \"quote\": \"\\\"\"}";
  pcStack_1440 = "{ \"backslash\": \"\\\\\"}";
  pcStack_1430 = "{ \"\": \"\"}";
  pcStack_1420 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_1410 = "{ \"nil\": \"\\u0000\"}";
  pcStack_1488 = (code *)0x132ad6;
  pvStack_1458 = pvVar9;
  puStack_1448 = __n;
  puStack_1438 = puVar14;
  uStack_1428 = uVar7;
  uStack_1418 = uVar6;
  bson_append_utf8(uStack_1408,"nil",0xffffffff,"",1);
  pvVar10 = (void *)0x8;
  while( true ) {
    pcStack_1488 = (code *)0x132b00;
    cVar1 = bson_init_from_json(auStack_1400,*(undefined8 *)((long)&pvStack_1478 + (long)pvVar10),
                                0xffffffffffffffff,auStack_1338);
    puVar16 = auStack_1400;
    pvVar13 = pvVar10;
    if (cVar1 == '\0') break;
    pcStack_1488 = (code *)0x132b13;
    pvStack_1478 = (void *)bson_get_data(auStack_1400);
    puVar16 = *(undefined1 **)((long)&pcStack_1470 + (long)pvVar10);
    pcStack_1488 = (code *)0x132b25;
    pvVar13 = (void *)bson_get_data(puVar16);
    if (*(uint *)(puVar16 + 4) != uStack_13fc) {
LAB_00132b9a:
      puVar14 = auStack_1400;
      pcStack_1488 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar14);
      pcStack_1488 = (code *)0x132bb9;
      uVar6 = bson_as_canonical_extended_json(puVar16);
      pvVar9 = pvStack_1478;
      uVar3 = *(uint *)(puVar16 + 4);
      if (uStack_13fc == 0) goto LAB_00132be8;
      uVar20 = 0;
      goto LAB_00132bcf;
    }
    pcStack_1488 = (code *)0x132b3c;
    puVar14 = (undefined1 *)bson_get_data(puVar16);
    pcStack_1488 = (code *)0x132b47;
    pvVar9 = (void *)bson_get_data(auStack_1400);
    pcStack_1488 = (code *)0x132b55;
    iVar2 = bcmp(puVar14,pvVar9,(ulong)*(uint *)(puVar16 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_1488 = (code *)0x132b64;
    bson_destroy(auStack_1400);
    pvVar10 = (void *)((long)pvVar10 + 0x10);
    __n = auStack_1400;
    pvVar9 = pvVar13;
    if (pvVar10 == (void *)0x78) {
      lVar5 = 8;
      do {
        pcStack_1488 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&pcStack_1470 + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x78);
      return;
    }
  }
  goto LAB_00132cac;
  while( true ) {
    if (*(char *)((long)pvStack_1478 + uVar20) != *(char *)((long)pvVar13 + uVar20))
    goto LAB_00132c91;
    uVar20 = uVar20 + 1;
    if (uStack_13fc == (uint)uVar20) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_00132be8:
  uVar4 = uStack_13fc;
  if (uStack_13fc < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_1488 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__n,uVar6);
    pcStack_1488 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_1488 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_147c = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar14 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)uStack_13fc;
    pcStack_1488 = (code *)0x132c6a;
    puVar15 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar15 != __n) goto LAB_00132ca2;
    puVar16 = (undefined1 *)(ulong)*(uint *)(puVar16 + 4);
    pcStack_1488 = (code *)0x132c80;
    puVar15 = (undefined1 *)write(uVar4,pvVar13,(size_t)puVar16);
    if (puVar15 != puVar16) goto LAB_00132ca7;
    uVar20 = (ulong)uVar4;
    pcStack_1488 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar6 = extraout_RAX_01;
LAB_00132c91:
    uVar20 = uVar20 & 0xffffffff;
  }
  pcStack_1488 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_1488 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_1488 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_1488 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
LAB_00132cac:
  pcStack_1488 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_1888[0] = (code *)0x132cd6;
  puStack_14b0 = puVar16;
  puStack_14a8 = __n;
  puStack_14a0 = puVar14;
  pvStack_1498 = pvVar13;
  pvStack_1490 = pvVar9;
  pcStack_1488 = (code *)apcStack_1088;
  uVar6 = bson_bcon_magic();
  apcStack_1888[0] = (code *)0x132cf5;
  pcVar12 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar6,0,"euro",0);
  apcStack_1888[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_1800,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_1738);
  if (cVar1 == '\0') {
    apcStack_1888[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_1888[0] = (code *)0x132d33;
    pvVar9 = (void *)bson_get_data(auStack_1800);
    apcStack_1888[0] = (code *)0x132d3e;
    pvVar13 = (void *)bson_get_data(pcVar12);
    if (*(uint *)(pcVar12 + 4) == uStack_17fc) {
      apcStack_1888[0] = (code *)0x132d53;
      pvVar10 = (void *)bson_get_data(pcVar12);
      apcStack_1888[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_1800);
      apcStack_1888[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar10,__s2,(ulong)*(uint *)(pcVar12 + 4));
      if (iVar2 == 0) {
        apcStack_1888[0] = (code *)0x132d82;
        bson_destroy(auStack_1800);
        apcStack_1888[0] = (code *)0x132d8a;
        bson_destroy(pcVar12);
        return;
      }
    }
    puVar14 = auStack_1800;
    apcStack_1888[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar14);
    apcStack_1888[0] = (code *)0x132db8;
    uVar6 = bson_as_canonical_extended_json(pcVar12);
    uVar3 = *(uint *)(pcVar12 + 4);
    if (uStack_17fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar9 + uVar20) != *(char *)((long)pvVar13 + uVar20))
        goto LAB_00132e88;
        uVar20 = uVar20 + 1;
      } while (uStack_17fc != (uint)uVar20);
    }
    uVar4 = uStack_17fc;
    if (uStack_17fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_1888[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__n,uVar6);
      apcStack_1888[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_1888[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_1804 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar14 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_17fc;
      apcStack_1888[0] = (code *)0x132e61;
      puVar16 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
      if (puVar16 != __n) goto LAB_00132e9e;
      pcVar12 = (char *)(ulong)*(uint *)(pcVar12 + 4);
      apcStack_1888[0] = (code *)0x132e77;
      pcVar8 = (char *)write(uVar4,pvVar13,(size_t)pcVar12);
      if (pcVar8 != pcVar12) goto LAB_00132ea3;
      uVar20 = (ulong)uVar4;
      apcStack_1888[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar6 = extraout_RAX_02;
LAB_00132e88:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_1888[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_1888[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_1888[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_1888[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_1c08 = (code *)0x132ed6;
  pcStack_1890 = pcVar12;
  apcStack_1888[0] = (code *)&pcStack_1488;
  cVar1 = bson_init_from_json(auStack_1c00,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_1b18);
  if (cVar1 == '\0') {
    if (iStack_1b18 != 1) goto LAB_00132f22;
    if (iStack_1b14 != 1) goto LAB_00132f27;
    pcVar12 = acStack_1b10;
    pcStack_1c08 = (code *)0x132f09;
    pcVar8 = strstr(pcVar12,"UESCAPE_TOOSHORT");
    if (pcVar8 != (char *)0x0) {
      pcStack_1c08 = (code *)0x132f16;
      bson_destroy(auStack_1c00);
      return;
    }
  }
  else {
    pcStack_1c08 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_1c08 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_1c08 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_1c08 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_2008 = (code *)0x132f67;
  pcStack_1c10 = pcVar12;
  pcStack_1c08 = (code *)apcStack_1888;
  cVar1 = bson_init_from_json(acStack_1f80,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_1e98);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_2008 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_2008 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_2008 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_2008 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_2000,acStack_1f80,"x");
    if (cVar1 == '\0') {
      pcStack_2008 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_2008 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_2008 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_2008 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_2008 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_2008 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_2008 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_2008 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_2008 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_2000);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_2008 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_2000);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar12 = acStack_1f80;
    pcStack_2008 = (code *)0x132fc2;
    bson_destroy(pcVar12);
    pcStack_2008 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_1e98);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_2008 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_2000,acStack_1f80,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_2008 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_2000);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_2008 = (code *)0x133020;
    bson_iter_int32(auStack_2000);
  }
  pcStack_2008 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_2008 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_2008 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_2008 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_2008 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_2408 = (code *)0x1331e2;
  pcStack_2018 = pcVar12;
  pvStack_2010 = pvVar13;
  pcStack_2008 = (code *)&pcStack_1c08;
  cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_22a0);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_2408 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_2408 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_2408 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_2408 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_2408 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_2408 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_2408 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_2408 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_2408 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_2408 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_2408 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_2408 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_2408 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_2408 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_2408 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_2408 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_2400,acStack_2380,"x");
    if (cVar1 == '\0') {
      pcStack_2408 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_2408 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_2408 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_2408 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_2408 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_2408 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_2408 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_2408 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_2408 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_2400);
    if (iVar2 != 0x12) goto LAB_00133458;
    pvVar13 = (void *)0x7fffffffffffffff;
    pcStack_2408 = (code *)0x13322c;
    lVar5 = bson_iter_int64(auStack_2400);
    if (lVar5 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar12 = acStack_2380;
    pcStack_2408 = (code *)0x133245;
    bson_destroy(pcVar12);
    pcStack_2408 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_2408 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_2400,acStack_2380,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_2408 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_2400);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_2408 = (code *)0x1332a3;
    lVar5 = bson_iter_int64(auStack_2400);
    pvVar13 = (void *)0x8000000000000000;
    if (lVar5 != -0x8000000000000000) goto LAB_0013349d;
    pcVar12 = acStack_2380;
    pcStack_2408 = (code *)0x1332bf;
    bson_destroy(pcVar12);
    pcStack_2408 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_22a0 != 1) goto LAB_001334a5;
    if (iStack_229c != 2) goto LAB_001334aa;
    pcVar12 = acStack_2298;
    pcStack_2408 = (code *)0x13331c;
    pcVar8 = strstr(pcVar12,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_001334af;
    pcStack_2408 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_22a0 != 1) goto LAB_001334b7;
    if (iStack_229c != 2) goto LAB_001334bc;
    pcStack_2408 = (code *)0x13337f;
    pcVar8 = strstr(pcVar12,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_001334c1;
    pcStack_2408 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_22a0 != 1) goto LAB_001334c9;
    if (iStack_229c != 2) goto LAB_001334ce;
    pcStack_2408 = (code *)0x1333e2;
    pcVar8 = strstr(pcVar12,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_001334d3;
    pcStack_2408 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_22a0 != 1) goto LAB_001334db;
    if (iStack_229c != 2) goto LAB_001334e0;
    pcStack_2408 = (code *)0x133441;
    pcVar8 = strstr(pcVar12,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_2408 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_2808 = (code *)0x133520;
  pcStack_2410 = pcVar12;
  pcStack_2408 = (code *)&pcStack_2008;
  cVar1 = bson_init_from_json(acStack_2780,"{ \"x\": 1 }",0xffffffffffffffff,auStack_2698);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_2808 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_2808 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_2808 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_2808 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_2808 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_2808 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_2808 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_2808 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_2808 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_2808 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') {
      pcStack_2808 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_2808 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_2808 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_2808 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_2808 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_2808 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_2808 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_2808 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_2808 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_2808 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_2808 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_2808 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_2808 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_2800);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar12 = acStack_2780;
    pcStack_2808 = (code *)0x133579;
    bson_destroy(pcVar12);
    pcStack_2808 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_2808 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_2808 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_2808 = (code *)0x1335d7;
    lVar5 = bson_iter_int64(auStack_2800);
    if (lVar5 != 0x100000000) goto LAB_001337e7;
    pcVar12 = acStack_2780;
    pcStack_2808 = (code *)0x1335fa;
    bson_destroy(pcVar12);
    pcStack_2808 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_2808 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_2808 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_2808 = (code *)0x133658;
    dVar29 = (double)bson_iter_double(auStack_2800);
    if ((dVar29 != 1.0) || (NAN(dVar29))) goto LAB_001337fc;
    pcVar12 = acStack_2780;
    pcStack_2808 = (code *)0x13367c;
    bson_destroy(pcVar12);
    pcStack_2808 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_2808 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_2808 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_2808 = (code *)0x1336da;
    dVar29 = (double)bson_iter_double(auStack_2800);
    if ((dVar29 != 0.0) || (NAN(dVar29))) goto LAB_00133811;
    pcVar12 = acStack_2780;
    pcStack_2808 = (code *)0x1336fe;
    bson_destroy(pcVar12);
    pcStack_2808 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar12,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_2808 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_2808 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_2808 = (code *)0x133754;
    dVar29 = (double)bson_iter_double(auStack_2800);
    if ((dVar29 == 0.0) && (!NAN(dVar29))) {
      pcStack_2808 = (code *)0x133770;
      bson_iter_double(auStack_2800);
      if (extraout_XMM0_Db < 0) {
        pcStack_2808 = (code *)0x133787;
        bson_destroy(acStack_2780);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_2808 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar8 = "2e400";
  ppuVar27 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_2830 = pcVar12;
  puStack_2828 = __n;
  puStack_2820 = puVar14;
  pvStack_2818 = pvVar13;
  pvStack_2810 = pvVar9;
  pcStack_2808 = (code *)&pcStack_2408;
  while( true ) {
    pcStack_2b88 = (code *)0x13386c;
    uVar6 = bson_strdup_printf("{ \"d\" : %s }",pcVar8);
    pcStack_2b88 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_2980,uVar6,0xffffffffffffffff,&iStack_2b80);
    if (cVar1 != '\0') break;
    if (iStack_2b80 != 1) goto LAB_00133953;
    if (iStack_2b7c != 2) goto LAB_0013394e;
    pcStack_2b88 = (code *)0x1338b7;
    pcVar12 = strstr(acStack_2b78,"out of range");
    if (pcVar12 == (char *)0x0) goto LAB_00133958;
    pcStack_2b88 = (code *)0x1338c8;
    bson_free(uVar6);
    pcStack_2b88 = (code *)0x1338d9;
    uVar6 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar8);
    pcStack_2b88 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_2980,uVar6,0xffffffffffffffff,&iStack_2b80);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_2b80 != 1) goto LAB_00133967;
    if (iStack_2b7c != 2) goto LAB_00133962;
    pcStack_2b88 = (code *)0x133918;
    pcVar12 = strstr(acStack_2b78,"out of range");
    if (pcVar12 == (char *)0x0) goto LAB_0013396c;
    pcStack_2b88 = (code *)0x133925;
    bson_free(uVar6);
    pcVar8 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
  pcStack_2b88 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_2b88 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_2b88 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_2b88 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_2b88 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_2b88 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_2b88 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_2b88 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_2ba0 = "out of range";
  pcVar11 = "{ \"d\": NaN }";
  ppuVar25 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_2f00;
  piVar26 = &iStack_2e38;
  piVar28 = (int *)0x14c766;
  pcVar12 = (char *)&dStack_2f08;
  uStack_2bb0 = uVar6;
  puStack_2ba8 = (undefined1 *)&iStack_2b80;
  pcStack_2b98 = pcVar8;
  ppuStack_2b90 = ppuVar27;
  pcStack_2b88 = (code *)&pcStack_2808;
  do {
    apcStack_2f88[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar11,0xffffffffffffffff,piVar26);
    if (cVar1 == '\0') {
      apcStack_2f88[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_2f88[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_2f88[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_2f88[0] = (code *)0x1339d7;
    uVar6 = bson_bcone_magic();
    apcStack_2f88[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar6,1,pcVar12,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_2f08) && !NAN(dStack_2f08)) goto LAB_00133b30;
    apcStack_2f88[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar11 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar8 = "{ \"d\": NaNn }";
  ppuVar25 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_2e30;
  piVar26 = aiStack_2f00;
  piVar28 = &iStack_2e38;
  pcVar12 = "Got parse error at";
  do {
    apcStack_2f88[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar26,pcVar8,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_2e38 != 1) goto LAB_00133b4c;
    if (iStack_2e34 != 1) goto LAB_00133b3f;
    apcStack_2f88[0] = (code *)0x133a91;
    pcVar8 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar8 == (char *)0x0) goto LAB_00133b44;
    pcVar8 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar8 = "{ \"d\": nu";
  ppuVar25 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar26 = aiStack_2f00;
  piVar28 = &iStack_2e38;
  pcVar12 = "Incomplete JSON";
  while( true ) {
    apcStack_2f88[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar26,pcVar8,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') break;
    if (iStack_2e38 != 1) goto LAB_00133b5e;
    if (iStack_2e34 != 1) goto LAB_00133b51;
    apcStack_2f88[0] = (code *)0x133b05;
    pcVar8 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar8 == (char *)0x0) goto LAB_00133b56;
    pcVar8 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_2f88[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_2f88[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_2f88[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_2f88[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_2f88[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_2f88[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_2f88[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar8 = "{ \"d\": Infinity }";
  ppuVar27 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_2fb0 = __haystack;
  pdStack_2fa8 = (double *)pcVar12;
  ppuStack_2fa0 = ppuVar25;
  piStack_2f98 = piVar26;
  piStack_2f90 = piVar28;
  apcStack_2f88[0] = (code *)&pcStack_2b88;
  do {
    apcStack_3388[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_3300,pcVar8,0xffffffffffffffff,&iStack_3238);
    if (cVar1 == '\0') {
      apcStack_3388[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_3388[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_3388[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_3388[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_3388[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_3300,"d",__haystack,1,&puStack_3308,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_3308)) ||
       (!NAN((double)puStack_3308 - (double)puStack_3308) &&
        !NAN((double)puStack_3308 - (double)puStack_3308))) goto LAB_00133dda;
    apcStack_3388[0] = (code *)0x133c0d;
    bson_destroy(auStack_3300);
    pcVar8 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar12 = "{ \"d\": -Infinity }";
  ppuVar27 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_3388[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_3300,pcVar12,0xffffffffffffffff,&iStack_3238);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_3388[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_3300,"d",__haystack,1,&puStack_3308,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_3308)) || (!NAN((double)puStack_3308 - (double)puStack_3308)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_3308) goto LAB_00133dee;
    apcStack_3388[0] = (code *)0x133cb5;
    bson_destroy(auStack_3300);
    pcVar12 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar8 = "{ \"d\": Infinityy }";
  ppuVar25 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_3230;
  ppuVar27 = (undefined **)&iStack_3238;
  pcVar12 = "Got parse error at";
  do {
    apcStack_3388[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_3300,pcVar8,0xffffffffffffffff,ppuVar27);
    if (cVar1 != '\0') goto LAB_00133df3;
    if (iStack_3238 != 1) goto LAB_00133e0a;
    if (iStack_3234 != 1) goto LAB_00133dfd;
    apcStack_3388[0] = (code *)0x133d37;
    pcVar8 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar8 == (char *)0x0) goto LAB_00133e02;
    pcVar8 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar8 = "{ \"d\": In";
  ppuVar25 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar27 = (undefined **)&iStack_3238;
  pcVar12 = "Incomplete JSON";
  while( true ) {
    apcStack_3388[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_3300,pcVar8,0xffffffffffffffff,ppuVar27);
    if (cVar1 != '\0') break;
    if (iStack_3238 != 1) goto LAB_00133e1c;
    if (iStack_3234 != 1) goto LAB_00133e0f;
    apcStack_3388[0] = (code *)0x133daf;
    pcVar8 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar8 == (char *)0x0) goto LAB_00133e14;
    pcVar8 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_3388[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_3388[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_3388[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_3388[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_3388[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_3388[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar14 = auStack_3300;
  apcStack_3388[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_3708 = (code *)0x133e4e;
  apcStack_3388[0] = (code *)apcStack_2f88;
  cVar1 = bson_init_from_json(auStack_3700,"{ \"x\": null }",0xffffffffffffffff,auStack_3610);
  if (cVar1 == '\0') {
    pcStack_3708 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_3708 = (code *)0x133e57;
    uVar6 = bson_bcone_magic();
    pcStack_3708 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_3700,"x",uVar6,9,0);
    if (cVar1 != '\0') {
      pcStack_3708 = (code *)0x133e7f;
      bson_destroy(auStack_3700);
      return;
    }
  }
  pcStack_3708 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_3b08 = (code *)0x0;
  pcStack_3b10 = "}";
  acStack_3b20[8] = -0x2e;
  acStack_3b20[9] = '>';
  acStack_3b20[10] = '\x13';
  acStack_3b20[0xb] = '\0';
  acStack_3b20[0xc] = '\0';
  acStack_3b20[0xd] = '\0';
  acStack_3b20[0xe] = '\0';
  acStack_3b20[0xf] = '\0';
  piStack_3730 = __haystack;
  pcStack_3728 = pcVar12;
  ppuStack_3720 = ppuVar25;
  puStack_3718 = puVar14;
  ppuStack_3710 = ppuVar27;
  pcStack_3708 = (code *)apcStack_3388;
  uVar20 = bcon_new(0,"a","{","b","{");
  uStack_3a10 = 0;
  uStack_3a08 = 0;
  uStack_3a20 = 0;
  uStack_3a18 = 0;
  uStack_3a30 = 0;
  uStack_3a28 = 0;
  uStack_3a40 = 0;
  uStack_3a38 = 0;
  uStack_3a50 = 0;
  uStack_3a48 = 0;
  uStack_3a60 = 0;
  uStack_3a58 = 0;
  uStack_3a70 = 0;
  uStack_3a68 = 0;
  uStack_3a80 = (undefined *)0x500000003;
  uStack_3a78 = 5;
  pcStack_3b08 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_3a80,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_39b8);
  if (cVar1 != '\0') {
    pcStack_3b08 = (code *)0x133f47;
    ppuVar27 = (undefined **)bson_get_data(&uStack_3a80);
    pcStack_3b08 = (code *)0x133f52;
    puVar14 = (undefined1 *)bson_get_data(uVar20);
    if (*(int *)(uVar20 + 4) == uStack_3a80._4_4_) {
      pcStack_3b08 = (code *)0x133f67;
      pvVar9 = (void *)bson_get_data(uVar20);
      pcStack_3b08 = (code *)0x133f77;
      pvVar10 = (void *)bson_get_data(&uStack_3a80);
      pcStack_3b08 = (code *)0x133f85;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(uVar20 + 4));
      if (iVar2 == 0) {
        pcStack_3b08 = (code *)0x133f96;
        bson_destroy(&uStack_3a80);
        pcStack_3b08 = (code *)0x133f9e;
        bson_destroy(uVar20);
        return;
      }
    }
    ppuVar25 = (undefined **)&uStack_3a80;
    pcStack_3b08 = (code *)0x133fbf;
    pcVar12 = (char *)bson_as_canonical_extended_json(ppuVar25);
    pcStack_3b08 = (code *)0x133fcc;
    uVar6 = bson_as_canonical_extended_json(uVar20);
    uVar3 = *(uint *)(uVar20 + 4);
    if (uStack_3a80._4_4_ != 0) {
      uVar21 = 0;
      do {
        if (uVar3 == (uint)uVar21) break;
        if (*(char *)((long)ppuVar27 + uVar21) != puVar14[uVar21]) goto LAB_0013409c;
        uVar21 = uVar21 + 1;
      } while (uStack_3a80._4_4_ != (uint)uVar21);
    }
    uVar4 = uStack_3a80._4_4_;
    if (uStack_3a80._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar21 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_3b08 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,pcVar12,uVar6);
      pcStack_3b08 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar12 = (char *)(ulong)uVar3;
      pcStack_3b08 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_3a84 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar25 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar12 = (char *)((ulong)uStack_3a80 >> 0x20);
      pcStack_3b08 = (code *)0x134075;
      pcVar8 = (char *)write(uVar3,ppuVar27,(size_t)pcVar12);
      if (pcVar8 != pcVar12) goto LAB_001340ad;
      uVar20 = (ulong)*(uint *)(uVar20 + 4);
      pcStack_3b08 = (code *)0x13408b;
      uVar21 = write(uVar4,puVar14,uVar20);
      if (uVar21 != uVar20) goto LAB_001340b2;
      uVar21 = (ulong)uVar4;
      pcStack_3b08 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar6 = extraout_RAX_03;
LAB_0013409c:
      uVar21 = uVar21 & 0xffffffff;
    }
    pcStack_3b08 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_3b08 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_3b08 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_3b08 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_3b08 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar8 = acStack_3b20;
  acStack_3b20[8] = '\0';
  acStack_3b20[9] = '\0';
  acStack_3b20[10] = '\0';
  acStack_3b20[0xb] = '\0';
  acStack_3b20[0xc] = '\0';
  acStack_3b20[0xd] = '\0';
  acStack_3b20[0xe] = '@';
  acStack_3b20[0xf] = '0';
  acStack_3b20[0] = '\v';
  acStack_3b20[1] = '\0';
  acStack_3b20[2] = '\0';
  acStack_3b20[3] = '\0';
  acStack_3b20[4] = '\0';
  acStack_3b20[5] = '\0';
  acStack_3b20[6] = '\0';
  acStack_3b20[7] = '\0';
  pcStack_3b30 = (code *)0x1340ea;
  pcStack_3b10 = (char *)uVar20;
  pcStack_3b08 = (code *)puVar14;
  plVar17 = (long *)bson_new();
  pcStack_3b30 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar17,"decimal128",0xffffffff,pcVar8);
  if (cVar1 == '\0') {
    pcStack_3b30 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_3b30 = (code *)0x134113;
    pcVar8 = (char *)bson_as_json(plVar17,auStack_3b28);
    if (pcVar8 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_3b30 = (code *)0x13413d;
      bson_free(pcVar8);
      pcStack_3b30 = (code *)0x134145;
      bson_destroy(plVar17);
      return;
    }
    pcStack_3b30 = (code *)0x134131;
    iVar2 = strcmp(pcVar8,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_3b30 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar30 = &pcStack_3b30;
  ppuStack_3f88 = (undefined **)0x13418d;
  plStack_3b38 = plVar17;
  pcStack_3b30 = (code *)&pcStack_3708;
  cVar1 = bson_init_from_json(auStack_3e80,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_3d98);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_3f88 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_3f00,auStack_3e80);
  if (cVar1 == '\0') {
    ppuStack_3f88 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_3f88 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_3f88 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_3f88 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_3f88 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_3f00,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_3f88 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_3f00);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar17 = &lStack_3f10;
    ppuStack_3f88 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_3f00,plVar17);
    if (lStack_3f10 != 0xb) goto LAB_00134227;
    if (lStack_3f08 == 0x3040000000000000) {
      ppuStack_3f88 = (undefined **)0x134211;
      bson_destroy(auStack_3e80);
      return;
    }
  }
  ppuStack_3f88 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_3f88 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar11 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar23 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_3fa0 = plVar17;
  pcStack_3f98 = pcVar12;
  pcStack_3f90 = pcVar8;
  ppuStack_3f88 = ppuVar27;
  do {
    pcStack_41b0 = (code *)0x134273;
    lVar5 = bson_new_from_json(pcVar11,0xffffffffffffffff,&iStack_41a0);
    if (lVar5 != 0) {
      pcStack_41b0 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_41b0 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_4198,
              ppuVar27);
      pcStack_41b0 = (code *)0x1342e3;
      abort();
    }
    if (iStack_41a0 != 1) {
LAB_001342e8:
      pcStack_41b0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_43c8 = (code *)0x13430d;
      pcStack_41b8 = acStack_4198;
      pcStack_41b0 = (code *)&iStack_41a0;
      pcVar12 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_43b8);
      pcStack_43c8 = (code *)0x13431a;
      pcVar8 = (char *)bson_as_json(pcVar12,0);
      if (pcVar8 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_43c8 = (code *)0x134344;
        bson_free(pcVar8);
        pcStack_43c8 = (code *)0x13434c;
        bson_destroy(pcVar12);
        return;
      }
      pcStack_43c8 = (code *)0x134338;
      iVar2 = strcmp(pcVar8,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_43c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_45d8 = 0x2200223a2261227b;
      uStack_45d0 = 0x7d;
      uStack_45dc = 0x227b;
      pcStack_43c8 = (code *)pcVar12;
      lVar5 = bson_new_from_json(&uStack_45d8,9,&iStack_45c8);
      if (lVar5 == 0) {
        if (iStack_45c8 != 1) goto LAB_00134418;
        if (iStack_45c4 != 1) goto LAB_0013441d;
        pcVar12 = acStack_45c0;
        pcVar11 = strstr(pcVar12,"Got parse error");
        if (pcVar11 == (char *)0x0) goto LAB_00134422;
        lVar5 = bson_new_from_json(&uStack_45dc,3,&iStack_45c8);
        if (lVar5 != 0) goto LAB_00134413;
        if (iStack_45c8 != 1) goto LAB_0013442a;
        if (iStack_45c4 == 1) {
          pcVar11 = strstr(pcVar12,"Got parse error");
          if (pcVar11 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar6 = extraout_RAX_04;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar7 = bson_bcon_magic();
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0,uVar6,pcVar12,ppuVar23,ppuVar25,pcVar8,ppuVar27,ppcVar30)
      ;
      uVar18 = bcon_new(0,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar6,uVar18,0);
      uVar6 = bson_new();
      uVar18 = bson_new();
      uVar19 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar6,uVar18,uVar19,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar6,0);
      uVar6 = bson_new();
      _test_json_produces_multiple("[]",0,uVar6,0);
      uVar6 = bcon_new(0,"0","{","x",uVar7,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar6,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_419c != 2) {
      pcStack_41b0 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar27 = (undefined **)ppuVar23[-1];
    pcStack_41b0 = (code *)0x13429a;
    pcVar12 = strstr(acStack_4198,(char *)ppuVar27);
    if (pcVar12 == (char *)0x0) goto LAB_001342c0;
    pcVar11 = *ppuVar23;
    ppuVar23 = ppuVar23 + 2;
    if (pcVar11 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_2f88[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_3388[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_3388[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_3388[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar25 = &puStack_3308;
  pcVar12 = "d";
  apcStack_3388[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_3388[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_number_long_zero (void)
{
   bson_error_t error;
   bson_iter_t iter;
   const char *json = "{ \"key\": { \"$numberLong\": \"0\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT (bson_iter_int64 (&iter) == 0);
   bson_destroy (&b);
}